

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit_suite.cpp
# Opt level: O0

void implicit_value_suite::visit_array(void)

{
  undefined4 local_50 [4];
  value local_40;
  visitor local_39;
  undefined1 local_38 [7];
  visitor vis;
  variable data;
  
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_40 = trial::dynamic::visit<implicit_value_suite::visitor&,std::allocator<char>>
                       (&local_39,(basic_variable<std::allocator<char>_> *)local_38);
  local_50[0] = 0x13;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0x1a4,"void implicit_value_suite::visit_array()",&local_40,local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void visit_array()
{
    variable data = array::make();
    visitor vis;
    TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::array);
}